

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syncprod.cc
# Opt level: O3

outgoing_edges_range_t *
tchecker::syncprod::outgoing_edges
          (outgoing_edges_range_t *__return_storage_ptr__,system_t *system,const_vloc_sptr_t *vloc)

{
  bool bVar1;
  range_t<tchecker::syncprod::vloc_synchronized_edges_iterator_t,_tchecker::end_iterator_t>
  sync_edges;
  range_t<tchecker::join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>,_tchecker::end_iterator_t>
  async_edges;
  outgoing_edges_iterator_t begin;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_260;
  range_t<tchecker::syncprod::vloc_synchronized_edges_iterator_t,_tchecker::end_iterator_t>
  local_240;
  range_t<tchecker::join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>,_tchecker::end_iterator_t>
  local_1c0;
  outgoing_edges_iterator_t local_138;
  
  outgoing_synchronized_edges(&local_240,system,vloc);
  outgoing_asynchronous_edges(&local_1c0,system,vloc);
  committed_processes(&local_260,system,vloc);
  outgoing_edges_iterator_t::outgoing_edges_iterator_t
            (&local_138,&local_240._begin,&local_1c0._begin,&local_260);
  bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (&local_260);
  if (bVar1) {
    if (local_260.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_260.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_260.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_260.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    outgoing_edges_iterator_t::outgoing_edges_iterator_t(&__return_storage_ptr__->_begin,&local_138)
    ;
    outgoing_edges_iterator_t::~outgoing_edges_iterator_t(&local_138);
    join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
    ::~join_iterator_t(&local_1c0._begin);
    vloc_synchronized_edges_iterator_t::~vloc_synchronized_edges_iterator_t(&local_240._begin);
    return __return_storage_ptr__;
  }
  __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x2be,
                "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

tchecker::syncprod::outgoing_edges_range_t outgoing_edges(tchecker::syncprod::system_t const & system,
                                                          tchecker::const_vloc_sptr_t const & vloc)
{
  tchecker::range_t<tchecker::syncprod::vloc_synchronized_edges_iterator_t, tchecker::end_iterator_t> sync_edges(
      tchecker::syncprod::outgoing_synchronized_edges(system, vloc));

  tchecker::range_t<tchecker::syncprod::vloc_asynchronous_edges_iterator_t, tchecker::end_iterator_t> async_edges(
      tchecker::syncprod::outgoing_asynchronous_edges(system, vloc));

  tchecker::syncprod::outgoing_edges_iterator_t begin(sync_edges.begin(), async_edges.begin(),
                                                      committed_processes(system, vloc));

  return tchecker::make_range(begin, tchecker::past_the_end_iterator);
}